

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void do_ssi_exec(mg_connection *conn,char *tag)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 local_440 [8];
  mg_file file;
  char cmd [1024];
  char *tag_local;
  mg_connection *conn_local;
  
  memset(&file.access,0,0x400);
  memset(local_440,0,0x28);
  iVar1 = __isoc99_sscanf(tag," \"%1023[^\"]\"",&file.access);
  if (iVar1 == 1) {
    file.stat._24_8_ = popen((char *)&file.access,"r");
    if ((FILE *)file.stat._24_8_ == (FILE *)0x0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_cry_internal_wrap
                (conn,(mg_context *)0x0,"do_ssi_exec",0x30a8,"Cannot SSI #exec: [%s]: %s",
                 &file.access,pcVar3);
    }
    else {
      send_file_data(conn,(mg_file *)local_440,0,0x7fffffffffffffff,0);
      pclose((FILE *)file.stat._24_8_);
    }
  }
  else {
    mg_cry_internal_wrap(conn,(mg_context *)0x0,"do_ssi_exec",0x30a1,"Bad SSI #exec: [%s]",tag);
  }
  return;
}

Assistant:

static void
do_ssi_exec(struct mg_connection *conn, char *tag)
{
	char cmd[1024] = "";
	struct mg_file file = STRUCT_FILE_INITIALIZER;

	if (sscanf(tag, " \"%1023[^\"]\"", cmd) != 1) {
		mg_cry_internal(conn, "Bad SSI #exec: [%s]", tag);
	} else {
		cmd[1023] = 0;
		if ((file.access.fp = popen(cmd, "r")) == NULL) {
			mg_cry_internal(conn,
			                "Cannot SSI #exec: [%s]: %s",
			                cmd,
			                strerror(ERRNO));
		} else {
			send_file_data(conn, &file, 0, INT64_MAX, 0); /* send static file */
			pclose(file.access.fp);
		}
	}
}